

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::TemplatedIndexOfHelper<true,Js::TypedArrayBase,unsigned_int>
              (TypedArrayBase *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  JavascriptBoolean *pJVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  ulong uVar7;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  Type TVar8;
  Var local_50;
  Var element;
  Var local_40;
  uint local_34;
  
  local_50 = (Var)0x0;
  uVar7 = (ulong)search & 0xffff000000000000;
  local_40 = search;
  local_34 = toIndex;
  if (((ulong)search & 0x1ffff00000000) == 0x1000000000000 || uVar7 != 0x1000000000000) {
    if (search == (Var)0x0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00b9fcf5:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b9ff49;
      *puVar6 = 0;
    }
    else {
      TVar8 = TypeIds_Number;
      if ((ulong)search >> 0x32 != 0 || uVar7 == 0x1000000000000) goto LAB_00b9fe1b;
    }
    this = UnsafeVarTo<Js::RecyclableObject>(local_40);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b9ff49;
      *puVar6 = 0;
    }
    TVar8 = ((this->type).ptr)->typeId;
    if ((int)TVar8 < 0x58) goto LAB_00b9fe1b;
    BVar5 = RecyclableObject::IsExternal(this);
    TVar8 = TypeIds_Number;
    if (BVar5 != 0) goto LAB_00b9fe1b;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00b9ff49;
    *puVar6 = 0;
    if (local_40 == (Var)0x0) goto LAB_00b9fcf5;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar4 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar4) {
LAB_00b9ff49:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
  TVar8 = TypeIds_Number;
LAB_00b9fe1b:
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar2 = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
  if (fromIndex < local_34) {
    element = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      BVar5 = TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
                        ((RecyclableObject *)pArr,fromIndex,&local_50,scriptContext,false);
      if (BVar5 == 0) {
        if (TVar8 == TypeIds_Undefined) {
          return element;
        }
      }
      else if (uVar7 == 0x1000000000000) {
        if (((ulong)local_50 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)local_50 & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)local_50 & 0xffff000000000000) != 0x1000000000000) goto LAB_00b9ff16;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar4) goto LAB_00b9ff49;
          *puVar6 = 0;
        }
        if (local_50 == local_40) {
          return element;
        }
      }
      else {
LAB_00b9ff16:
        bVar4 = JavascriptConversion::SameValueCommon<true>(local_50,local_40);
        if (bVar4) {
          return element;
        }
      }
      fromIndex = fromIndex + 1;
    } while (local_34 != fromIndex);
  }
  return pJVar2;
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }